

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O2

int ludp_send(lua_State *L)

{
  uint in_EAX;
  int iVar1;
  skynet_context *ctx;
  lua_Integer lVar2;
  char *address;
  void *buffer;
  uint uStack_38;
  int sz;
  
  uStack_38 = in_EAX;
  ctx = (skynet_context *)lua_touserdata(L,-0xf4629);
  lVar2 = luaL_checkinteger(L,1);
  address = luaL_checklstring(L,2,(size_t *)0x0);
  _uStack_38 = (ulong)uStack_38;
  buffer = get_buffer(L,3,&sz);
  iVar1 = skynet_socket_udp_send(ctx,(int)lVar2,address,buffer,sz);
  lua_pushboolean(L,(uint)(iVar1 == 0));
  return 1;
}

Assistant:

static int
ludp_send(lua_State *L) {
	struct skynet_context * ctx = lua_touserdata(L, lua_upvalueindex(1));
	int id = luaL_checkinteger(L, 1);
	const char * address = luaL_checkstring(L, 2);
	int sz = 0;
	void *buffer = get_buffer(L, 3, &sz);
	int err = skynet_socket_udp_send(ctx, id, address, buffer, sz);

	lua_pushboolean(L, !err);

	return 1;
}